

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O3

void SequenceSpanTask::run(search *sch,multi_ex *ec)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  ptag hi;
  uint32_t uVar5;
  uint32_t uVar6;
  action aVar7;
  pointer ppeVar8;
  stringstream *psVar9;
  ostream *poVar10;
  pointer ppeVar11;
  ulong uVar12;
  action aVar13;
  bool bVar14;
  predictor P;
  char local_141;
  ulong local_140;
  search *local_138;
  v_array<unsigned_int> *local_130;
  multi_ex *local_128;
  size_t local_120;
  predictor local_118;
  
  piVar2 = (int *)sch->task_data;
  local_138 = sch;
  local_128 = ec;
  Search::predictor::predictor(&local_118,sch,0);
  uVar12 = *(ulong *)(piVar2 + 0x12);
  if (uVar12 != 0) {
    local_130 = (v_array<unsigned_int> *)(piVar2 + 2);
    ppeVar8 = (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar11 = (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    local_140 = 1;
    do {
      bVar14 = ppeVar11 != ppeVar8;
      ppeVar11 = ppeVar8;
      if (bVar14) {
        local_120 = local_140 - 1;
        aVar7 = 1;
        uVar12 = 0;
        do {
          uVar1 = (ppeVar8[uVar12]->l).multi.label;
          lVar3 = *(long *)(piVar2 + 4);
          lVar4 = *(long *)(piVar2 + 2);
          hi = (ptag)uVar12;
          Search::predictor::set_tag(&local_118,hi + 1);
          Search::predictor::set_learner_id(&local_118,local_120);
          aVar13 = uVar1;
          if (*piVar2 == 1) {
            if ((aVar7 == 1) || ((aVar7 & 3) - 1 < 2)) {
              Search::predictor::set_allowed(&local_118,local_130);
              aVar13 = (uint)(uVar1 != 0);
              if ((uVar1 & 2) != 0) {
                aVar13 = uVar1;
              }
            }
            else {
              aVar13 = aVar7 + 2;
              if ((aVar7 & 3) != 3) {
                aVar13 = aVar7;
              }
              Search::predictor::set_allowed(&local_118,aVar7 + 1);
              Search::predictor::add_allowed(&local_118,aVar13);
              if (uVar1 == aVar7 + 1) {
                aVar13 = uVar1;
              }
            }
          }
          else if (*piVar2 == 0) {
            if (aVar7 == 1) {
              Search::predictor::set_allowed(&local_118,local_130->_begin,(lVar3 - lVar4 >> 2) - 1);
            }
            else {
              *(action *)((long)local_130->_begin + (lVar3 - lVar4) + -4) = aVar7 | 1;
              Search::predictor::set_allowed(&local_118,local_130);
            }
            if ((((aVar7 != uVar1) && (1 < uVar1)) && ((uVar1 & 1) != 0)) && (aVar7 != uVar1 - 1)) {
              aVar13 = 1;
            }
          }
          Search::predictor::set_input
                    (&local_118,
                     (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar12]);
          uVar5 = Search::search::get_history_length(local_138);
          Search::predictor::set_condition_range(&local_118,hi,uVar5,'p');
          if (1 < local_140) {
            uVar5 = Search::search::get_history_length(local_138);
            uVar6 = Search::search::get_history_length(local_138);
            Search::predictor::add_condition_range(&local_118,uVar5 + hi + 1,uVar6 + 1,'a');
          }
          Search::predictor::set_oracle(&local_118,aVar13);
          aVar7 = Search::predictor::predict(&local_118);
          if ((local_140 == *(ulong *)(piVar2 + 0x12)) &&
             (psVar9 = Search::search::output_abi_cxx11_(local_138),
             *(int *)(psVar9 + *(long *)(*(long *)psVar9 + -0x18) + 0x20) == 0)) {
            psVar9 = Search::search::output_abi_cxx11_(local_138);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar9 + 0x10));
            local_141 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_141,1);
          }
          uVar12 = uVar12 + 1;
          ppeVar8 = (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          ppeVar11 = (local_128->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
        } while (uVar12 < (ulong)((long)ppeVar11 - (long)ppeVar8 >> 3));
        uVar12 = *(ulong *)(piVar2 + 0x12);
      }
      local_140 = local_140 + 1;
    } while (local_140 <= uVar12);
  }
  Search::predictor::~predictor(&local_118);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  v_array<action>* y_allowed = &(D.allowed_actions);
  Search::predictor P(sch, (ptag)0);
  for (size_t pass = 1; pass <= D.multipass; pass++)
  {
    action last_prediction = 1;
    for (size_t i = 0; i < ec.size(); i++)
    {
      action oracle = ec[i]->l.multi.label;
      size_t len = y_allowed->size();
      P.set_tag((ptag)i + 1);
      P.set_learner_id(pass - 1);
      if (D.encoding == BIO)
      {
        if (last_prediction == 1)
          P.set_allowed(y_allowed->begin(), len - 1);
        else if (last_prediction % 2 == 0)
        {
          (*y_allowed)[len - 1] = last_prediction + 1;
          P.set_allowed(*y_allowed);
        }
        else
        {
          (*y_allowed)[len - 1] = last_prediction;
          P.set_allowed(*y_allowed);
        }
        if ((oracle > 1) && (oracle % 2 == 1) && (last_prediction != oracle) && (last_prediction != oracle - 1))
          oracle = 1;  // if we are supposed to I-X, but last wasn't B-X or I-X, then say O
      }
      else if (D.encoding == BILOU)
      {
        if ((last_prediction == 1) || ((last_prediction - 2) % 4 == 0) ||
            ((last_prediction - 2) % 4 == 3))  // O or unit-X or last-X
        {
          P.set_allowed(D.allowed_actions);
          // we cannot allow in-X or last-X next
          if ((oracle > 1) && (((oracle - 2) % 4 == 2) || ((oracle - 2) % 4 == 3)))
            oracle = 1;
        }
        else  // begin-X or in-X
        {
          action other = ((last_prediction - 2) % 4 == 1) ? (last_prediction + 2) : last_prediction;
          P.set_allowed(last_prediction + 1);
          P.add_allowed(other);
          if ((oracle != last_prediction + 1) && (oracle != other))
            oracle = other;
        }
      }
      P.set_input(*ec[i]);
      P.set_condition_range((ptag)i, sch.get_history_length(), 'p');
      if (pass > 1)
        P.add_condition_range((ptag)(i + 1 + sch.get_history_length()), sch.get_history_length() + 1, 'a');
      P.set_oracle(oracle);
      last_prediction = P.predict();

      if ((pass == D.multipass) && sch.output().good())
        sch.output() << ((D.encoding == BIO) ? last_prediction : bilou_to_bio(last_prediction)) << ' ';
    }
  }
}